

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dbformat.cc
# Opt level: O2

void __thiscall
leveldb::InternalKeyComparator::FindShortestSeparator
          (InternalKeyComparator *this,string *start,Slice *limit)

{
  long lVar1;
  uint __line;
  int iVar2;
  size_t sVar3;
  char *pcVar4;
  long in_FS_OFFSET;
  pointer local_88;
  size_type sStack_80;
  Slice user_limit;
  Slice user_start;
  string tmp;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  tmp._M_dataplus._M_p = (start->_M_dataplus)._M_p;
  tmp._M_string_length = start->_M_string_length;
  user_start = ExtractUserKey((Slice *)&tmp);
  sVar3 = user_start.size_;
  pcVar4 = user_start.data_;
  user_limit = ExtractUserKey(limit);
  tmp._M_dataplus._M_p = (pointer)&tmp.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&tmp,pcVar4,pcVar4 + sVar3);
  (*this->user_comparator_->_vptr_Comparator[4])(this->user_comparator_,&tmp,&user_limit);
  if (tmp._M_string_length < user_start.size_) {
    local_88 = tmp._M_dataplus._M_p;
    sStack_80 = tmp._M_string_length;
    iVar2 = (*this->user_comparator_->_vptr_Comparator[2])(this->user_comparator_,&user_start);
    if (iVar2 < 0) {
      PutFixed64(&tmp,0xffffffffffffff01);
      local_88 = (start->_M_dataplus)._M_p;
      sStack_80 = start->_M_string_length;
      iVar2 = (*(this->super_Comparator)._vptr_Comparator[2])(this);
      if (iVar2 < 0) {
        local_88 = tmp._M_dataplus._M_p;
        sStack_80 = tmp._M_string_length;
        iVar2 = (*(this->super_Comparator)._vptr_Comparator[2])(this,&local_88,limit);
        if (iVar2 < 0) {
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::swap
                    (start,&tmp);
          goto LAB_00548402;
        }
        pcVar4 = "this->Compare(tmp, limit) < 0";
        __line = 0x50;
      }
      else {
        pcVar4 = "this->Compare(*start, tmp) < 0";
        __line = 0x4f;
      }
      __assert_fail(pcVar4,
                    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/leveldb/db/dbformat.cc"
                    ,__line,
                    "virtual void leveldb::InternalKeyComparator::FindShortestSeparator(std::string *, const Slice &) const"
                   );
    }
  }
LAB_00548402:
  std::__cxx11::string::~string((string *)&tmp);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void InternalKeyComparator::FindShortestSeparator(std::string* start,
                                                  const Slice& limit) const {
  // Attempt to shorten the user portion of the key
  Slice user_start = ExtractUserKey(*start);
  Slice user_limit = ExtractUserKey(limit);
  std::string tmp(user_start.data(), user_start.size());
  user_comparator_->FindShortestSeparator(&tmp, user_limit);
  if (tmp.size() < user_start.size() &&
      user_comparator_->Compare(user_start, tmp) < 0) {
    // User key has become shorter physically, but larger logically.
    // Tack on the earliest possible number to the shortened user key.
    PutFixed64(&tmp,
               PackSequenceAndType(kMaxSequenceNumber, kValueTypeForSeek));
    assert(this->Compare(*start, tmp) < 0);
    assert(this->Compare(tmp, limit) < 0);
    start->swap(tmp);
  }
}